

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

void __thiscall common::Options::Options(Options *this)

{
  Options *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->group);
  std::__cxx11::string::string((string *)&this->tag);
  std::__cxx11::string::string((string *)&this->params);
  this->index = -1;
  this->log_level = -1;
  std::__cxx11::string::string((string *)&this->log_file);
  std::__cxx11::string::string((string *)&this->config_file);
  std::__cxx11::string::operator=((string *)&this->config_file,"/etc/xtools.conf");
  return;
}

Assistant:

Options::Options() : index(-1), log_level(-1) {
    config_file = "/etc/xtools.conf";
}